

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O2

void __thiscall CppJieba::MixSegment::~MixSegment(MixSegment *this)

{
  ~MixSegment(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~MixSegment()
            {
                dispose();
            }